

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O2

void __thiscall BoardView::HandlePDFBridgeSelection(BoardView *this)

{
  bool bVar1;
  string selection;
  string local_38;
  
  bVar1 = PDFBridgeEvince::HasNewSelection(&this->pdfBridge);
  if (bVar1) {
    PDFBridgeEvince::GetSelection_abi_cxx11_(&local_38,&this->pdfBridge);
    if (local_38._M_string_length == 0) {
      std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::clear
                (&this->m_pinHighlighted);
      std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::clear
                (&this->m_partHighlighted);
    }
    else {
      SearchCompound(this,local_38._M_dataplus._M_p);
      CenterZoomSearchResults(this);
    }
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void BoardView::HandlePDFBridgeSelection() {
	if (pdfBridge.HasNewSelection()) {
		auto selection = pdfBridge.GetSelection();
		if (selection.empty()) {
			m_pinHighlighted.clear();
			m_partHighlighted.clear();
		} else {
			SearchCompound(selection.c_str());
			CenterZoomSearchResults();
		}
	};
}